

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

shared_ptr<notch::core::ActivationLayer> __thiscall
notch::core::MakeLayer::activation(MakeLayer *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  MakeLayer *in_RSI;
  shared_ptr<notch::core::ActivationLayer> sVar2;
  allocator local_39;
  string local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  if (in_RSI->maybeActivation == (Activation *)0x0) {
    in_RSI->maybeActivation = (Activation *)linearActivation;
  }
  if (in_RSI->nInputs == 0 && in_RSI->nOutputs != 0) {
    in_RSI->nInputs = in_RSI->nOutputs;
  }
  else if (in_RSI->nInputs == 0) {
    ::std::__cxx11::string::string((string *)&local_38,"an ActivationLayer",&local_39);
    logic_error(in_RSI,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
    this->nInputs = 0;
    this->nOutputs = 0;
    _Var1._M_pi = extraout_RDX;
    goto LAB_00115696;
  }
  sVar2 = ::std::
          make_shared<notch::core::ActivationLayer,unsigned_long&,notch::core::Activation_const&>
                    (&this->nInputs,(Activation *)in_RSI);
  _Var1 = sVar2.super___shared_ptr<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
LAB_00115696:
  sVar2.super___shared_ptr<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<notch::core::ActivationLayer>)
         sVar2.super___shared_ptr<notch::core::ActivationLayer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ActivationLayer> activation() {
        if (!maybeActivation) {
            maybeActivation = &linearActivation;
        }
        if (nOutputs && !nInputs) {
            nInputs = nOutputs;
        }
        if (nInputs) {
            return std::make_shared<ActivationLayer>(nInputs, *maybeActivation);
        } else {
            logic_error("an ActivationLayer");
            return nullptr; // unreachable
        }
    }